

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  heap_queue *heap;
  int *piVar1;
  file_info ***pppfVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  int iVar13;
  file_info *pfVar14;
  file_info *re;
  uint64_t uVar15;
  byte *pbVar16;
  content *pcVar17;
  file_info *pfVar18;
  void *pvVar19;
  long *plVar20;
  size_t sVar21;
  file_info ***pppfVar22;
  uchar *p;
  char *fmt;
  uint uVar23;
  ulong uVar24;
  size_t min;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  byte *isodirrec;
  anon_struct_16_2_ec647c9d_for_cache_files *paVar29;
  bool bVar30;
  ulong uStack_90;
  file_info *local_70;
  anon_struct_16_2_ec647c9d empty_files;
  
  do {
    pfVar14 = cache_get_entry(iso9660);
    if (pfVar14 != (file_info *)0x0) {
      *pfile = pfVar14;
      uStack_90 = 0;
      goto LAB_004b8cbc;
    }
    heap = &iso9660->pending_files;
    while( true ) {
      pfVar14 = heap_get_entry(heap);
      *pfile = pfVar14;
      if (pfVar14 == (file_info *)0x0) break;
      if (pfVar14->cl_offset == 0) {
        if ((pfVar14->mode & 0xf000) != 0x4000) goto LAB_004b8b5e;
        pvVar6 = a->format->data;
        if (*(long *)((long)pvVar6 + 0xe0) != 0) {
          __archive_read_consume(a,*(long *)((long)pvVar6 + 0xe0));
          *(undefined8 *)((long)pvVar6 + 0xe0) = 0;
        }
        uVar24 = *(ulong *)((long)pvVar6 + 0xa0);
        uVar7 = pfVar14->offset;
        if (uVar7 < uVar24) {
          archive_set_error(&a->archive,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                            (pfVar14->name).s);
LAB_004b8b23:
          uStack_90 = 0xffffffffffffffec;
          goto LAB_004b8cbc;
        }
        uVar15 = pfVar14->size;
        if (*(ulong *)((long)pvVar6 + 0xb0) < uVar15 + uVar7) {
          archive_set_error(&a->archive,-1,"Directory is beyond end-of-media: %s",(pfVar14->name).s)
          ;
          goto LAB_004b8b23;
        }
        if (uVar7 < uVar24 || uVar7 - uVar24 == 0) {
LAB_004b861f:
          uVar24 = (*(ulong *)((long)pvVar6 + 0xa8) + uVar15) - 1;
          min = uVar24 - uVar24 % *(ulong *)((long)pvVar6 + 0xa8);
          pbVar16 = (byte *)__archive_read_ahead(a,min,(ssize_t *)0x0);
          if (pbVar16 == (byte *)0x0) {
            fmt = "Failed to read full block when scanning ISO9660 directory list";
            iVar13 = -1;
LAB_004b8ce9:
            archive_set_error(&a->archive,iVar13,fmt);
LAB_004b8adf:
            uStack_90 = 0xffffffffffffffe2;
            goto LAB_004b8cbc;
          }
          *(long *)((long)pvVar6 + 0xa0) = *(long *)((long)pvVar6 + 0xa0) + min;
          local_70 = (file_info *)0x0;
          sVar21 = min;
          while (isodirrec = pbVar16, sVar21 != 0) {
            pbVar16 = isodirrec + *(long *)((long)pvVar6 + 0xa8);
            sVar21 = sVar21 - *(long *)((long)pvVar6 + 0xa8);
            for (; (((ulong)*isodirrec != 0 && (isodirrec < pbVar16)) &&
                   (isodirrec + *isodirrec <= pbVar16)); isodirrec = isodirrec + *isodirrec) {
              if ((isodirrec[0x20] != 1) || (1 < isodirrec[0x21])) {
                pfVar18 = parse_file_info(a,pfVar14,isodirrec,(long)pbVar16 - (long)isodirrec);
                if (pfVar18 == (file_info *)0x0) {
LAB_004b8ad2:
                  __archive_read_consume(a,min);
                  goto LAB_004b8adf;
                }
                if ((pfVar18->cl_offset == 0) &&
                   (iVar13 = pfVar18->multi_extent, local_70 != (file_info *)0x0 || iVar13 != 0)) {
                  if (local_70 == (file_info *)0x0) {
                    (pfVar18->contents).first = (content *)0x0;
                    (pfVar18->contents).last = &(pfVar18->contents).first;
                    local_70 = pfVar18;
                  }
                  pcVar17 = (content *)malloc(0x18);
                  if (pcVar17 == (content *)0x0) {
                    archive_set_error(&a->archive,0xc,"No memory for multi extent");
                    goto LAB_004b8ad2;
                  }
                  uVar15 = pfVar18->offset;
                  pcVar17->offset = uVar15;
                  uVar8 = pfVar18->size;
                  pcVar17->size = uVar8;
                  pcVar17->next = (content *)0x0;
                  *(local_70->contents).last = pcVar17;
                  (local_70->contents).last = &pcVar17->next;
                  if (local_70 != pfVar18) {
                    local_70->size = local_70->size + uVar8;
                    if (iVar13 == 0) {
                      local_70 = (file_info *)0x0;
                    }
                    goto LAB_004b87cb;
                  }
                }
                else {
                  uVar15 = pfVar18->offset;
                }
                iVar13 = heap_add_entry(a,(heap_queue *)((long)pvVar6 + 0x70),pfVar18,uVar15);
                if (iVar13 != 0) goto LAB_004b8adf;
              }
LAB_004b87cb:
            }
          }
          __archive_read_consume(a,min);
          uVar24 = *(ulong *)((long)pvVar6 + 0xa8);
          while ((*(int *)((long)pvVar6 + 0x40) != 0 &&
                 (**(long **)((long)pvVar6 + 0x38) == *(long *)((long)pvVar6 + 0xa0)))) {
            pvVar19 = __archive_read_ahead(a,uVar24,(ssize_t *)0x0);
            if (pvVar19 == (void *)0x0) {
              fmt = "Failed to read full block when scanning ISO9660 directory list";
              iVar13 = -1;
              goto LAB_004b8ce9;
            }
            plVar20 = *(long **)((long)pvVar6 + 0x38);
            do {
              pfVar18 = (file_info *)plVar20[1];
              uVar23 = pfVar18->ce_offset;
              uVar5 = pfVar18->ce_size;
              if (uVar24 < uVar5 + uVar23) {
                fmt = "Malformed CE information";
                iVar13 = 0x54;
                goto LAB_004b8ce9;
              }
              if (0 < *(int *)((long)pvVar6 + 0x40)) {
                uVar25 = *(int *)((long)pvVar6 + 0x40) - 1;
                *(uint *)((long)pvVar6 + 0x40) = uVar25;
                lVar10 = (plVar20 + (ulong)uVar25 * 2)[1];
                *plVar20 = plVar20[(ulong)uVar25 * 2];
                plVar20[1] = lVar10;
                uVar7 = **(ulong **)((long)pvVar6 + 0x38);
                iVar13 = 0;
                while( true ) {
                  iVar26 = iVar13 * 2 + 1;
                  if (*(int *)((long)pvVar6 + 0x40) <= iVar26) break;
                  lVar10 = *(long *)((long)pvVar6 + 0x38);
                  uVar27 = *(ulong *)(lVar10 + (long)iVar26 * 0x10);
                  iVar28 = iVar13 * 2 + 2;
                  if ((iVar28 < *(int *)((long)pvVar6 + 0x40)) &&
                     (uVar9 = *(ulong *)(lVar10 + (long)iVar28 * 0x10), uVar9 < uVar27)) {
                    uVar27 = uVar9;
                    iVar26 = iVar28;
                  }
                  if (uVar7 <= uVar27) break;
                  puVar3 = (undefined8 *)(lVar10 + (long)iVar13 * 0x10);
                  empty_files.first = (file_info *)*puVar3;
                  empty_files.last = (file_info **)puVar3[1];
                  puVar3 = (undefined8 *)(lVar10 + (long)iVar26 * 0x10);
                  uVar12 = puVar3[1];
                  puVar4 = (undefined8 *)(lVar10 + (long)iVar13 * 0x10);
                  *puVar4 = *puVar3;
                  puVar4[1] = uVar12;
                  puVar3 = (undefined8 *)(*(long *)((long)pvVar6 + 0x38) + (long)iVar26 * 0x10);
                  *puVar3 = empty_files.first;
                  puVar3[1] = empty_files.last;
                  iVar13 = iVar26;
                }
              }
              p = (uchar *)((ulong)uVar23 + (long)pvVar19);
              iVar13 = parse_rockridge(a,pfVar18,p,p + uVar5);
              if (iVar13 != 0) goto LAB_004b8adf;
            } while ((*(int *)((long)pvVar6 + 0x40) != 0) &&
                    (plVar20 = *(long **)((long)pvVar6 + 0x38),
                    *plVar20 == *(long *)((long)pvVar6 + 0xa0)));
            __archive_read_consume(a,uVar24);
            *(long *)((long)pvVar6 + 0xa0) = *(long *)((long)pvVar6 + 0xa0) + uVar24;
          }
        }
        else {
          uStack_90 = __archive_read_consume(a,uVar7 - uVar24);
          if (-1 < (long)uStack_90) {
            *(uint64_t *)((long)pvVar6 + 0xa0) = pfVar14->offset;
            uVar15 = pfVar14->size;
            goto LAB_004b861f;
          }
          if ((int)uStack_90 != 0) goto LAB_004b8cbc;
        }
        if (pfVar14->rr_moved == '\0') {
          if (pfVar14->re == '\0') {
            if ((pfVar14->re_descendant == '\0') || (iVar13 = rede_add_entry(pfVar14), iVar13 != 0))
            goto LAB_004b8b5e;
          }
          else {
            pfVar14->re_next = (file_info *)0x0;
            *(iso9660->re_files).last = pfVar14;
            (iso9660->re_files).last = &pfVar14->re_next;
          }
        }
        else if (pfVar14->rr_moved_has_re_only == '\0') goto LAB_004b8b5e;
      }
      else {
        pfVar18 = (file_info *)0x0;
        while( true ) {
          re = re_get_entry(iso9660);
          if (re == pfVar18) goto LAB_004b8b5e;
          if (re->offset == pfVar14->cl_offset) break;
          if (pfVar18 == (file_info *)0x0) {
            pfVar18 = re;
          }
          re->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = re;
          (iso9660->re_files).last = &re->re_next;
        }
        piVar1 = &re->parent->subdirs;
        *piVar1 = *piVar1 + -1;
        pfVar18 = pfVar14->parent;
        re->parent = pfVar18;
        re->re = '\0';
        if (pfVar18->re_descendant == '\0') {
          *pfile = re;
          while (pfVar18 = rede_get_entry(re), pfVar14 = re, pfVar18 != (file_info *)0x0) {
            pfVar18->next = (file_info *)0x0;
            *(iso9660->cache_files).last = pfVar18;
            (iso9660->cache_files).last = &pfVar18->next;
          }
LAB_004b8b5e:
          uStack_90 = 0;
          if (((pfVar14->mode & 0xf000) == 0x8000) &&
             (lVar10 = pfVar14->number, uStack_90 = 0, lVar10 != -1)) {
            paVar29 = &iso9660->cache_files;
            (iso9660->cache_files).first = (file_info *)0x0;
            (iso9660->cache_files).last = &paVar29->first;
            empty_files.first = (file_info *)0x0;
            pppfVar2 = &(iso9660->cache_files).last;
            empty_files.last = &empty_files.first;
            iVar13 = 0;
            while ((0 < (iso9660->pending_files).used &&
                   (lVar11 = (*heap->files)->number, lVar11 == -1 || lVar11 == lVar10))) {
              bVar30 = pfVar14->number != -1;
              pppfVar22 = &empty_files.last;
              if (bVar30) {
                pppfVar22 = pppfVar2;
              }
              iVar13 = iVar13 + (uint)bVar30;
              pfVar14->next = (file_info *)0x0;
              **pppfVar22 = pfVar14;
              *pppfVar22 = &pfVar14->next;
              pfVar14 = heap_get_entry(heap);
            }
            if (iVar13 == 0) {
              *pfile = pfVar14;
            }
            else {
              bVar30 = pfVar14->number != -1;
              pppfVar22 = &empty_files.last;
              if (bVar30) {
                pppfVar22 = pppfVar2;
              }
              uVar23 = iVar13 + (uint)bVar30;
              pfVar14->next = (file_info *)0x0;
              **pppfVar22 = pfVar14;
              *pppfVar22 = &pfVar14->next;
              if (1 < uVar23) {
                while (pfVar14 = paVar29->first, pfVar14 != (file_info *)0x0) {
                  pfVar14->nlinks = uVar23;
                  paVar29 = (anon_struct_16_2_ec647c9d_for_cache_files *)&pfVar14->next;
                }
              }
              if (empty_files.first != (file_info *)0x0) {
                **pppfVar2 = empty_files.first;
                *pppfVar2 = empty_files.last;
              }
              pfVar14 = cache_get_entry(iso9660);
              *pfile = pfVar14;
            }
            uStack_90 = (ulong)(pfVar14 == (file_info *)0x0);
          }
          goto LAB_004b8cbc;
        }
        re->re_descendant = '\x01';
        pfVar18 = re;
        do {
          iVar13 = rede_add_entry(pfVar18);
          if (iVar13 < 0) {
            archive_set_error(&a->archive,-1,
                              "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                              ,iso9660->current_position,pfVar14->cl_offset);
            goto LAB_004b8adf;
          }
          pfVar18 = rede_get_entry(re);
        } while (pfVar18 != (file_info *)0x0);
      }
    }
    if ((((iso9660->re_files).first != (file_info *)0x0) &&
        (pfVar14 = iso9660->rr_moved, pfVar14 != (file_info *)0x0)) &&
       (pfVar14->rr_moved_has_re_only != '\0')) {
      pfVar14->next = (file_info *)0x0;
      *(iso9660->cache_files).last = pfVar14;
      (iso9660->cache_files).last = &pfVar14->next;
    }
    while (pfVar14 = re_get_entry(iso9660), pfVar14 != (file_info *)0x0) {
      while (pfVar18 = rede_get_entry(pfVar14), pfVar18 != (file_info *)0x0) {
        pfVar18->next = (file_info *)0x0;
        *(iso9660->cache_files).last = pfVar18;
        (iso9660->cache_files).last = &pfVar18->next;
      }
    }
  } while ((iso9660->cache_files).first != (file_info *)0x0);
  uStack_90 = 1;
LAB_004b8cbc:
  return (int)uStack_90;
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are still remaining, expose their.
			 */
			if (iso9660->re_files.first != NULL && 
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put back. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offset was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}